

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Skip(SequentialFileImpl *this,uint64_t n)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong in_RDX;
  uint64_t available;
  Slice local_30;
  ulong local_20;
  uint64_t n_local;
  SequentialFileImpl *this_local;
  
  uVar2 = *(ulong *)(n + 0x10);
  local_20 = in_RDX;
  n_local = n;
  this_local = this;
  uVar1 = FileState::Size(*(FileState **)(n + 8));
  if (uVar1 < uVar2) {
    Slice::Slice(&local_30,"pos_ > file_->Size()");
    Slice::Slice((Slice *)&available);
    Status::IOError((Status *)this,&local_30,(Slice *)&available);
  }
  else {
    uVar1 = FileState::Size(*(FileState **)(n + 8));
    uVar2 = uVar1 - *(long *)(n + 0x10);
    if (uVar2 < local_20) {
      local_20 = uVar2;
    }
    *(ulong *)(n + 0x10) = local_20 + *(long *)(n + 0x10);
    Status::OK();
  }
  return (Status)(char *)this;
}

Assistant:

Status Skip(uint64_t n) override {
    if (pos_ > file_->Size()) {
      return Status::IOError("pos_ > file_->Size()");
    }
    const uint64_t available = file_->Size() - pos_;
    if (n > available) {
      n = available;
    }
    pos_ += n;
    return Status::OK();
  }